

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall soplex::SPxSolverBase<double>::factorizeAndRecompute(SPxSolverBase<double> *this)

{
  SPxOut *pSVar1;
  undefined8 in_RAX;
  Verbosity old_verbosity;
  undefined8 local_18;
  
  local_18 = in_RAX;
  if (0 < (this->super_SPxBasisBase<double>).updateCount) {
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])(this);
  }
  computeFrhs(this);
  SPxBasisBase<double>::solve
            (&this->super_SPxBasisBase<double>,&this->theFvec->super_VectorBase<double>,
             this->theFrhs);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
    [(ulong)(this->theType == LEAVE) + 0x7c])(this);
  SPxBasisBase<double>::coSolve
            (&this->super_SPxBasisBase<double>,&this->theCoPvec->super_VectorBase<double>,
             this->theCoPrhs);
  computePvec(this);
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  pSVar1 = this->spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (3 < (int)pSVar1->m_verbosity)) {
    local_18 = CONCAT44(pSVar1->m_verbosity,4);
    (*pSVar1->_vptr_SPxOut[2])();
    std::__ostream_insert<char,std::char_traits<char>>
              (this->spxout->m_streams[this->spxout->m_verbosity],
               " --- checking feasibility and optimality\n",0x29);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,(long)&local_18 + 4);
  }
  if (this->theType == LEAVE) {
    computeFtest(this);
  }
  else {
    computeCoTest(this);
    computeTest(this);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::factorizeAndRecompute()
   {
      // refactorize to eliminate accumulated errors from LU updates
      if(this->lastUpdate() > 0)
         factorize();

      computeFrhs();
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);
      type() == LEAVE ? computeLeaveCoPrhs() : computeEnterCoPrhs();

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      computePvec();

      forceRecompNonbasicValue();

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- checking feasibility and optimality\n")

      if(type() == LEAVE)
         computeFtest();
      else
      {
         computeCoTest();
         computeTest();
      }
   }